

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

void __thiscall
cfd::TransactionContext::SplitTxOut
          (TransactionContext *this,uint32_t index,
          vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *amount_list,
          vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *address_list)

{
  pointer pAVar1;
  pointer this_00;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> locking_script_list;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> local_88;
  Script local_68;
  
  local_88.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pAVar1 = (address_list->
           super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (address_list->
                 super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>).
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pAVar1; this_00 = this_00 + 1)
  {
    core::Address::GetLockingScript(&local_68,this_00);
    std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::
    emplace_back<cfd::core::Script>(&local_88,&local_68);
    core::Script::~Script(&local_68);
  }
  SplitTxOut(this,index,amount_list,&local_88);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector(&local_88);
  return;
}

Assistant:

void TransactionContext::SplitTxOut(
    uint32_t index, const std::vector<Amount>& amount_list,
    const std::vector<Address>& address_list) {
  std::vector<Script> locking_script_list;
  for (const auto& addr : address_list) {
    locking_script_list.emplace_back(addr.GetLockingScript());
  }
  SplitTxOut(index, amount_list, locking_script_list);
}